

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

int osx9orBetter(void)

{
  int iVar1;
  char *pcVar2;
  int local_418;
  uint local_414;
  int v;
  int V;
  FILE *lIn;
  char lBuff [1024];
  
  if (osx9orBetter::lOsx9orBetter < 0) {
    osx9orBetter::lOsx9orBetter = 0;
    _v = popen("osascript -e \'set osver to system version of (system info)\'","r");
    pcVar2 = fgets((char *)&lIn,0x400,_v);
    if (((pcVar2 != (char *)0x0) &&
        (iVar1 = __isoc99_sscanf(&lIn,"%d.%d",&local_414,&local_418), iVar1 == 2)) &&
       (local_414 = local_414 * 100 + local_418, 0x3f0 < (int)local_414)) {
      osx9orBetter::lOsx9orBetter = 1;
    }
    pclose(_v);
    if (tinyfd_verbose != 0) {
      printf("Osx10 = %d, %d = %s\n",(ulong)(uint)osx9orBetter::lOsx9orBetter,(ulong)local_414,&lIn)
      ;
    }
  }
  return osx9orBetter::lOsx9orBetter;
}

Assistant:

static int osx9orBetter( )
{
        static int lOsx9orBetter = -1 ;
        char lBuff [MAX_PATH_OR_CMD] ;
        FILE * lIn ;
        int V,v;

        if ( lOsx9orBetter < 0 )
        {
                lOsx9orBetter = 0 ;
                lIn = popen( "osascript -e 'set osver to system version of (system info)'" , "r" ) ;
                if ( ( fgets( lBuff , sizeof( lBuff ) , lIn ) != NULL )
                        && ( 2 == sscanf(lBuff, "%d.%d", &V, &v) ) )
                {
                        V = V * 100 + v;
                        if ( V >= 1009 )
                        {
                                lOsx9orBetter = 1 ;
                        }
                }
                pclose( lIn ) ;
                if (tinyfd_verbose) printf("Osx10 = %d, %d = %s\n", lOsx9orBetter, V, lBuff) ; 
        }
        return lOsx9orBetter ;
}